

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_texparameterfv
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  bool bVar1;
  NotSupportedError *this_00;
  allocator<char> local_71;
  string local_70;
  GLuint local_4c;
  GLfloat local_48;
  GLuint texture;
  GLfloat params [1];
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_EXT_texture_sRGB_decode",&local_31);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_48 = 9729.0;
    local_4c = 0x1234;
    glu::CallLogWrapper::glGenTextures(&local_10->super_CallLogWrapper,1,&local_4c);
    glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0xde1,local_4c);
    this = local_10;
    local_48 = -1.0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
               ,&local_71);
    NegativeTestContext::beginSection(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    glu::CallLogWrapper::glTexParameterfv(&local_10->super_CallLogWrapper,0xde1,0x8a48,&local_48);
    NegativeTestContext::expectError(local_10,0x500);
    NegativeTestContext::endSection(local_10);
    glu::CallLogWrapper::glDeleteTextures(&local_10->super_CallLogWrapper,1,&local_4c);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
             ,0xf86);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void srgb_decode_texparameterfv (NegativeTestContext& ctx)
{
	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	GLfloat	params[1]	= {GL_LINEAR};
	GLuint	texture		= 0x1234;

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	params[0] = -1.0f;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SRGB_DECODE_EXT, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}